

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoring-table.cpp
# Opt level: O0

pair<int,_int> __thiscall
mahjong::ScoringTable::nonDealerSelfDrawn(ScoringTable *this,int doubling_factor,int minipoints)

{
  pair<int,_int> pVar1;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int basic;
  int minipoints_local;
  int doubling_factor_local;
  ScoringTable *this_local;
  
  local_20 = minipoints;
  basic = doubling_factor;
  _minipoints_local = this;
  local_24 = basicPoints(this,doubling_factor,minipoints);
  local_28 = roundUp(this,local_24);
  local_2c = roundUp(this,local_24 << 1);
  pVar1 = std::make_pair<int,int>(&local_28,&local_2c);
  return pVar1;
}

Assistant:

std::pair<int, int> ScoringTable::nonDealerSelfDrawn(int doubling_factor, int minipoints) const
{
	auto basic = basicPoints(doubling_factor, minipoints);
	return make_pair(roundUp(basic), roundUp(2 * basic));
}